

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sorter.cpp
# Opt level: O2

void __thiscall duckdb::MergeSorter::MergeRadix(MergeSorter *this,idx_t *count,bool *left_smaller)

{
  SBScanState *pSVar1;
  idx_t iVar2;
  size_type __n;
  SortLayout *pSVar3;
  pointer puVar4;
  _Head_base<0UL,_duckdb::RowDataBlock_*,_false> _Var5;
  _Head_base<0UL,_duckdb::SBScanState_*,_false> this_00;
  _Head_base<0UL,_duckdb::SortedBlock_*,_false> _Var6;
  type this_01;
  type pSVar7;
  reference pvVar8;
  data_ptr_t pdVar9;
  pointer pRVar10;
  pointer pSVar11;
  idx_t *entry_size;
  size_type sVar12;
  ulong __n_00;
  shared_ptr<duckdb::BlockHandle,_true> local_f8;
  RowDataBlock *local_e0;
  type local_d8;
  SortedBlock *local_d0;
  idx_t copied;
  idx_t *local_c0;
  SortLayout *local_b8;
  _Head_base<0UL,_duckdb::SBScanState_*,_false> local_b0;
  data_ptr_t result_ptr;
  _Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_> local_a0;
  _Head_base<0UL,_duckdb::SortedBlock_*,_false> local_98;
  SortedBlock *local_90;
  data_ptr_t r_ptr;
  data_ptr_t l_ptr;
  unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true> *local_78;
  bool *local_70;
  idx_t local_68;
  idx_t iStack_60;
  idx_t local_58;
  idx_t iStack_50;
  BufferHandle result_handle;
  
  local_a0.super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::SortedBlock_*,_false>)&this->left;
  local_70 = left_smaller;
  this_01 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator*((unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>
                       *)local_a0.super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl);
  local_78 = &this->right;
  pSVar7 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
           operator*(local_78);
  local_58 = this_01->block_idx;
  iStack_50 = this_01->entry_idx;
  local_68 = pSVar7->block_idx;
  iStack_60 = pSVar7->entry_idx;
  local_d0 = this_01->sb;
  pSVar1 = (SBScanState *)pSVar7->sb;
  pvVar8 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
           ::back(&this->result->radix_sorting_data);
  local_e0 = (pvVar8->
             super_unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>).
             _M_t.
             super___uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>
             .super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
  (*this->buffer_manager->_vptr_BufferManager[7])(&result_handle);
  pdVar9 = BufferHandle::Ptr(&result_handle);
  local_b8 = (SortLayout *)&this_01->entry_idx;
  local_c0 = &pSVar7->entry_idx;
  result_ptr = pdVar9 + this->sort_layout->entry_size * local_e0->count;
  copied = 0;
  local_d8 = pSVar7;
  local_b0._M_head_impl = pSVar1;
  local_98._M_head_impl = (SortedBlock *)this;
  while (this_00._M_head_impl = local_b0._M_head_impl, copied < *count) {
    if (this_01->block_idx <
        (ulong)((long)(local_d0->radix_sorting_data).
                      super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_d0->radix_sorting_data).
                      super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      iVar2 = local_b8->column_count;
      pvVar8 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
               ::get<true>(&local_d0->radix_sorting_data,this_01->block_idx);
      pRVar10 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                operator->(pvVar8);
      if (iVar2 == pRVar10->count) {
        local_f8.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        local_f8.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pvVar8 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                 ::get<true>(&local_d0->radix_sorting_data,this_01->block_idx);
        pRVar10 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->(pvVar8);
        shared_ptr<duckdb::BlockHandle,_true>::operator=(&pRVar10->block,&local_f8);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_f8.internal.
                    super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        this_01->block_idx = this_01->block_idx + 1;
        this_01->entry_idx = 0;
      }
    }
    __n_00 = pSVar7->block_idx;
    if (__n_00 < (ulong)((long)(this_00._M_head_impl)->sort_layout -
                         (long)(((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                                  *)&(this_00._M_head_impl)->buffer_manager)->
                               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                               ).
                               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      iVar2 = *local_c0;
      pvVar8 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                            *)this_00._M_head_impl,__n_00);
      pSVar7 = local_d8;
      pRVar10 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                operator->(pvVar8);
      __n_00 = pSVar7->block_idx;
      if (iVar2 == pRVar10->count) {
        local_f8.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        local_f8.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pvVar8 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                 ::get<true>((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                              *)this_00._M_head_impl,__n_00);
        pRVar10 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->(pvVar8);
        shared_ptr<duckdb::BlockHandle,_true>::operator=(&pRVar10->block,&local_f8);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_f8.internal.
                    super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        __n_00 = local_d8->block_idx + 1;
        local_d8->block_idx = __n_00;
        local_d8->entry_idx = 0;
      }
    }
    __n = this_01->block_idx;
    sVar12 = (long)(local_d0->radix_sorting_data).
                   super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_d0->radix_sorting_data).
                   super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
    pSVar3 = (local_b0._M_head_impl)->sort_layout;
    puVar4 = (((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                *)&(local_b0._M_head_impl)->buffer_manager)->
             super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (__n == sVar12) {
      local_f8.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      pvVar8 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
               ::get<true>(&local_d0->radix_sorting_data,__n);
      _Var5._M_head_impl =
           (pvVar8->
           super_unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>)._M_t.
           super___uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>
           .super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
      pSVar11 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                operator->((unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>
                            *)local_a0.super__Head_base<0UL,_duckdb::SortedBlock_*,_false>.
                              _M_head_impl);
      SBScanState::PinRadix(pSVar11,this_01->block_idx);
      l_ptr = SBScanState::RadixPtr(this_01);
      local_f8.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(_Var5._M_head_impl)->count;
    }
    pSVar7 = local_d8;
    if (__n_00 == (long)pSVar3 - (long)puVar4 >> 3) {
      FlushRows((MergeSorter *)&copied,&l_ptr,&local_b8->column_count,(idx_t *)&local_f8,local_e0,
                &result_ptr,
                &((SortLayout *)
                 ((local_98._M_head_impl)->radix_sorting_data).
                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->entry_size,&copied,count);
      pSVar7 = local_d8;
    }
    else {
      pvVar8 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                            *)local_b0._M_head_impl,local_d8->block_idx);
      _Var6._M_head_impl = local_98._M_head_impl;
      _Var5._M_head_impl =
           (pvVar8->
           super_unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>)._M_t.
           super___uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>
           .super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
      SBScanState::PinRadix(pSVar7,pSVar7->block_idx);
      r_ptr = SBScanState::RadixPtr(pSVar7);
      local_90 = (SortedBlock *)(_Var5._M_head_impl)->count;
      entry_size = &(*(SortLayout **)((long)_Var6._M_head_impl + 0x10))->entry_size;
      if (__n == sVar12) {
        FlushRows((MergeSorter *)&copied,&r_ptr,local_c0,(idx_t *)&local_90,local_e0,&result_ptr,
                  entry_size,&copied,count);
      }
      else {
        MergeRows((MergeSorter *)&copied,&l_ptr,&local_b8->column_count,(idx_t *)&local_f8,&r_ptr,
                  local_c0,(idx_t *)&local_90,local_e0,&result_ptr,entry_size,local_70,&copied,count
                 );
      }
    }
  }
  pSVar11 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator->((unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>
                        *)local_a0.super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl)
  ;
  pSVar11->block_idx = local_58;
  pSVar11->entry_idx = iStack_50;
  pSVar11 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator->(local_78);
  pSVar11->block_idx = local_68;
  pSVar11->entry_idx = iStack_60;
  BufferHandle::~BufferHandle(&result_handle);
  return;
}

Assistant:

void MergeSorter::MergeRadix(const idx_t &count, const bool left_smaller[]) {
	auto &l = *left;
	auto &r = *right;
	// Save indices to restore afterwards
	idx_t l_block_idx_before = l.block_idx;
	idx_t l_entry_idx_before = l.entry_idx;
	idx_t r_block_idx_before = r.block_idx;
	idx_t r_entry_idx_before = r.entry_idx;

	auto &l_blocks = l.sb->radix_sorting_data;
	auto &r_blocks = r.sb->radix_sorting_data;
	RowDataBlock *l_block = nullptr;
	RowDataBlock *r_block = nullptr;

	data_ptr_t l_ptr;
	data_ptr_t r_ptr;

	RowDataBlock *result_block = result->radix_sorting_data.back().get();
	auto result_handle = buffer_manager.Pin(result_block->block);
	data_ptr_t result_ptr = result_handle.Ptr() + result_block->count * sort_layout.entry_size;

	idx_t copied = 0;
	while (copied < count) {
		// Move to the next block (if needed)
		if (l.block_idx < l_blocks.size() && l.entry_idx == l_blocks[l.block_idx]->count) {
			// Delete reference to previous block
			l_blocks[l.block_idx]->block = nullptr;
			// Advance block
			l.block_idx++;
			l.entry_idx = 0;
		}
		if (r.block_idx < r_blocks.size() && r.entry_idx == r_blocks[r.block_idx]->count) {
			// Delete reference to previous block
			r_blocks[r.block_idx]->block = nullptr;
			// Advance block
			r.block_idx++;
			r.entry_idx = 0;
		}
		const bool l_done = l.block_idx == l_blocks.size();
		const bool r_done = r.block_idx == r_blocks.size();
		// Pin the radix sortable blocks
		idx_t l_count;
		if (!l_done) {
			l_block = l_blocks[l.block_idx].get();
			left->PinRadix(l.block_idx);
			l_ptr = l.RadixPtr();
			l_count = l_block->count;
		} else {
			l_count = 0;
		}
		idx_t r_count;
		if (!r_done) {
			r_block = r_blocks[r.block_idx].get();
			r.PinRadix(r.block_idx);
			r_ptr = r.RadixPtr();
			r_count = r_block->count;
		} else {
			r_count = 0;
		}
		// Copy using computed merge
		if (!l_done && !r_done) {
			// Both sides have data - merge
			MergeRows(l_ptr, l.entry_idx, l_count, r_ptr, r.entry_idx, r_count, *result_block, result_ptr,
			          sort_layout.entry_size, left_smaller, copied, count);
		} else if (r_done) {
			// Right side is exhausted
			FlushRows(l_ptr, l.entry_idx, l_count, *result_block, result_ptr, sort_layout.entry_size, copied, count);
		} else {
			// Left side is exhausted
			FlushRows(r_ptr, r.entry_idx, r_count, *result_block, result_ptr, sort_layout.entry_size, copied, count);
		}
	}
	// Reset block indices
	left->SetIndices(l_block_idx_before, l_entry_idx_before);
	right->SetIndices(r_block_idx_before, r_entry_idx_before);
}